

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge,uchar *data)

{
  int iVar1;
  void *in_RSI;
  uchar *in_stack_00000028;
  secp256k1_ge *in_stack_00000030;
  
  iVar1 = secp256k1_memcmp_var(in_RSI,"",0x40);
  if (iVar1 == 0) {
    secp256k1_ge_set_infinity((secp256k1_ge *)0x132143);
  }
  else {
    secp256k1_ge_from_bytes(in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

static void secp256k1_ge_from_bytes_ext(secp256k1_ge *ge, const unsigned char *data) {
    static const unsigned char zeros[64] = { 0 };
    if (secp256k1_memcmp_var(data, zeros, sizeof(zeros)) == 0) {
        secp256k1_ge_set_infinity(ge);
    } else {
        secp256k1_ge_from_bytes(ge, data);
    }
}